

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

string * helics::typeNameStringRef_abi_cxx11_(DataType type)

{
  int iVar1;
  int in_EDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_27;
  undefined1 local_26 [2];
  allocator<char> local_24;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  undefined1 local_20 [2];
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d [5];
  string *local_8;
  
  local_d._1_4_ = in_EDI;
  if (typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 doubleString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(local_d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 intString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(local_1d);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 stringString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(&local_1e);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 complexString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)(local_20 + 1));
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_)
      ;
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 boolString_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)local_20);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 doubleVecString_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffa8 = &local_21;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(&local_21);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::
                           doubleVecString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 complexVecString_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffa0 = &local_22;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_22);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::
                           complexVecString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 namedPointString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(&local_23);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::
                           namedPointString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 timeString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(&local_24);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 jsonString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)(local_26 + 1));
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 charString_abi_cxx11_);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_26;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator((allocator<char> *)local_26);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 anyString_abi_cxx11_);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 in_stack_ffffffffffffffa0);
      std::allocator<char>::~allocator(&local_27);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_);
    }
  }
  if (typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&typeNameStringRef[abi:cxx11](helics::DataType)::
                                 nullString_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(in_stack_ffffffffffffff80);
      __cxa_atexit(std::__cxx11::string::~string,
                   &typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_);
    }
  }
  if (local_d._1_4_ == 0) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::stringString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 1) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::doubleString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 2) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::intString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 3) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::complexString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 4) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::doubleVecString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 5) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::complexVecString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 6) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::namedPointString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 7) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::boolString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 8) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::timeString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 9) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::charString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 0x1e) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::jsonString_abi_cxx11_;
  }
  else if (local_d._1_4_ == 0x62ae) {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::anyString_abi_cxx11_;
  }
  else {
    local_8 = &typeNameStringRef[abi:cxx11](helics::DataType)::nullString_abi_cxx11_;
  }
  return local_8;
}

Assistant:

const std::string& typeNameStringRef(DataType type)
{
    static const std::string doubleString("double");
    static const std::string intString("int64");
    static const std::string stringString("string");
    static const std::string complexString("complex");
    static const std::string boolString("bool");
    static const std::string doubleVecString("double_vector");
    static const std::string complexVecString("complex_vector");
    static const std::string namedPointString("named_point");
    static const std::string timeString("time");
    static const std::string jsonString("json");
    static const std::string charString("char");
    static const std::string anyString("any");
    static const std::string nullString;
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return doubleString;
        case DataType::HELICS_INT:
            return intString;
        case DataType::HELICS_BOOL:
            return boolString;
        case DataType::HELICS_STRING:
            return stringString;
        case DataType::HELICS_COMPLEX:
            return complexString;
        case DataType::HELICS_TIME:
            return timeString;
        case DataType::HELICS_VECTOR:
            return doubleVecString;
        case DataType::HELICS_COMPLEX_VECTOR:
            return complexVecString;
        case DataType::HELICS_NAMED_POINT:
            return namedPointString;
        case DataType::HELICS_JSON:
            return jsonString;
        case DataType::HELICS_CHAR:
            return charString;
        case DataType::HELICS_ANY:
            return anyString;
        default:
            return nullString;
    }
}